

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O1

bool spvIsVulkanEnv(spv_target_env env)

{
  bool bVar1;
  
  bVar1 = false;
  if (env < (SPV_ENV_MAX|SPV_ENV_VULKAN_1_0)) {
    if ((0x2a40002U >> (env & (SPV_ENV_UNIVERSAL_1_6|SPV_ENV_OPENGL_4_2)) & 1) == 0) {
      if (env == SPV_ENV_WEBGPU_0) {
        __assert_fail("false && \"Deprecated target environment value.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/spirv_target_env.cpp"
                      ,0xea,"bool spvIsVulkanEnv(spv_target_env)");
      }
      bVar1 = false;
      if (env == SPV_ENV_MAX) {
        __assert_fail("false && \"Invalid target environment value.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/spirv_target_env.cpp"
                      ,0xed,"bool spvIsVulkanEnv(spv_target_env)");
      }
    }
    else {
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool spvIsVulkanEnv(spv_target_env env) {
  switch (env) {
    case SPV_ENV_UNIVERSAL_1_0:
    case SPV_ENV_OPENCL_1_2:
    case SPV_ENV_OPENCL_EMBEDDED_1_2:
    case SPV_ENV_OPENCL_2_0:
    case SPV_ENV_OPENCL_EMBEDDED_2_0:
    case SPV_ENV_OPENCL_2_1:
    case SPV_ENV_OPENCL_EMBEDDED_2_1:
    case SPV_ENV_OPENGL_4_0:
    case SPV_ENV_OPENGL_4_1:
    case SPV_ENV_OPENGL_4_2:
    case SPV_ENV_OPENGL_4_3:
    case SPV_ENV_OPENGL_4_5:
    case SPV_ENV_UNIVERSAL_1_1:
    case SPV_ENV_UNIVERSAL_1_2:
    case SPV_ENV_OPENCL_2_2:
    case SPV_ENV_OPENCL_EMBEDDED_2_2:
    case SPV_ENV_UNIVERSAL_1_3:
    case SPV_ENV_UNIVERSAL_1_4:
    case SPV_ENV_UNIVERSAL_1_5:
    case SPV_ENV_UNIVERSAL_1_6:
      return false;
    case SPV_ENV_VULKAN_1_0:
    case SPV_ENV_VULKAN_1_1:
    case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
    case SPV_ENV_VULKAN_1_2:
    case SPV_ENV_VULKAN_1_3:
      return true;
    case SPV_ENV_WEBGPU_0:
      assert(false && "Deprecated target environment value.");
      break;
    case SPV_ENV_MAX:
      assert(false && "Invalid target environment value.");
      break;
  }
  return false;
}